

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void prvTidyAddStringLiteral(Lexer *lexer,ctmbstr str)

{
  char ch;
  char *pcVar1;
  
  ch = *str;
  if (ch != '\0') {
    pcVar1 = str + 1;
    do {
      AddByte(lexer,ch);
      ch = *pcVar1;
      pcVar1 = pcVar1 + 1;
    } while (ch != '\0');
  }
  return;
}

Assistant:

void TY_(AddStringLiteral)( Lexer* lexer, ctmbstr str )
{
    byte c;
    while(0 != (c = *str++) ) {
        /*\
         *  Issue #286
         *  Previously this used TY_(AddCharToLexer)( lexer, c );
         *  which uses err = TY_(EncodeCharToUTF8Bytes)( c, buf, NULL, &count );
         *  But this is transferring already 'translated' data from an
         *  internal location to the lexer, so should use AddByte()
        \*/
        AddByte( lexer, c );
    }
}